

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.cpp
# Opt level: O0

ConstantValue * __thiscall slang::CVConstIterator::operator*(CVConstIterator *this)

{
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Kuree[P]hgdb_rtl_extern_slang_source_numeric_ConstantValue_cpp:654:9),_const_std::variant<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>_&>
  pCVar1;
  anon_class_1_0_00000001 local_11;
  CVConstIterator *local_10;
  CVConstIterator *this_local;
  
  local_10 = this;
  pCVar1 = std::operator*(&local_11,&this->current);
  return pCVar1;
}

Assistant:

const ConstantValue& CVConstIterator::operator*() const {
    return std::visit(
        [](auto&& arg) -> const ConstantValue& {
            using T = std::decay_t<decltype(arg)>;
            if constexpr (std::is_same_v<T, AssociativeArray::const_iterator>)
                return arg->second;
            else
                return *arg;
        },
        current);
}